

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair_mat.h
# Opt level: O2

int encode_char(char c)

{
  int iVar1;
  void *pvVar2;
  undefined7 in_register_00000039;
  
  iVar1 = toupper((int)CONCAT71(in_register_00000039,c));
  if (energy_set < 1) {
    pvVar2 = memchr("_ACGUTXKI",(int)(char)iVar1,10);
    iVar1 = (int)pvVar2 + -0x126ab0;
    if (pvVar2 == (void *)0x0) {
      iVar1 = 0;
    }
    if (5 < iVar1) {
      iVar1 = 0;
    }
    iVar1 = iVar1 - (uint)(4 < iVar1);
  }
  else {
    iVar1 = (char)iVar1 + -0x40;
  }
  return iVar1;
}

Assistant:

static INLINE int
encode_char(char c)
{
  /* return numerical representation of base used e.g. in pair[][] */
  int code;

  c = toupper(c);

  if (energy_set > 0) {
    code = (int)(c - 'A') + 1;
  } else {
    const char *pos;
    pos = strchr(Law_and_Order, c);
    if (pos == NULL)
      code = 0;
    else
      code = (int)(pos - Law_and_Order);

    if (code > 5)
      code = 0;

    if (code > 4)
      code--;           /* make T and U equivalent */
  }

  return code;
}